

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gv_visitor.cpp
# Opt level: O0

void __thiscall gv_visitor::visit(gv_visitor *this,MoreThanOneMethodArgs *ptr)

{
  Method_arg *second;
  bool bVar1;
  vector<Method_arg_*,_std::allocator<Method_arg_*>_> *this_00;
  reference ppMVar2;
  Method_arg *i;
  iterator __end1;
  iterator __begin1;
  vector<Method_arg_*,_std::allocator<Method_arg_*>_> *__range1;
  allocator<char> local_39;
  string local_38;
  MoreThanOneMethodArgs *local_18;
  MoreThanOneMethodArgs *ptr_local;
  gv_visitor *this_local;
  
  local_18 = ptr;
  ptr_local = (MoreThanOneMethodArgs *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"mnogo args",&local_39);
  box(this,ptr,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  this_00 = &(local_18->super_Method_args).args;
  __end1 = std::vector<Method_arg_*,_std::allocator<Method_arg_*>_>::begin(this_00);
  i = (Method_arg *)std::vector<Method_arg_*,_std::allocator<Method_arg_*>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Method_arg_**,_std::vector<Method_arg_*,_std::allocator<Method_arg_*>_>_>
                                *)&i);
    if (!bVar1) break;
    ppMVar2 = __gnu_cxx::
              __normal_iterator<Method_arg_**,_std::vector<Method_arg_*,_std::allocator<Method_arg_*>_>_>
              ::operator*(&__end1);
    second = *ppMVar2;
    arrow(this,local_18,second);
    (**(second->super_Base)._vptr_Base)(second,this);
    __gnu_cxx::
    __normal_iterator<Method_arg_**,_std::vector<Method_arg_*,_std::allocator<Method_arg_*>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void gv_visitor::visit(MoreThanOneMethodArgs* ptr) {
    box(ptr, "mnogo args");
    for(auto i : ptr->args) {
        arrow(ptr, i);
        i->accept(this);
    }
}